

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::SimpleQueriesTest::iterate(SimpleQueriesTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLboolean boolValue;
  GLfloat floatValue;
  GLint intValue;
  GLdouble doubleValue;
  GLint64 int64Value;
  undefined1 local_1a8 [384];
  long lVar4;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x798))(0x91b0,&boolValue);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getBooleanv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x5f);
    (**(code **)(lVar4 + 0x868))(0x91b0,&intValue);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x62);
    (**(code **)(lVar4 + 0x850))(0x91b0,&int64Value);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getInteger64v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x65);
    (**(code **)(lVar4 + 0x818))(0x91b0,&floatValue);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getFloatv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x68);
    (**(code **)(lVar4 + 0x7f8))(0x91b0,&doubleValue);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getDoublev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x6b);
    if (((((bool)boolValue == (intValue != 0)) && (intValue == (int)int64Value)) &&
        (intValue == (int)floatValue)) && (intValue == (int)doubleValue)) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Simple queries returned different values: ");
      std::operator<<((ostream *)this_00,"bool(");
      std::ostream::operator<<(this_00,(uint)boolValue);
      std::operator<<((ostream *)this_00,"), ");
      std::operator<<((ostream *)this_00,"int(");
      std::ostream::operator<<(this_00,intValue);
      std::operator<<((ostream *)this_00,"), ");
      std::operator<<((ostream *)this_00,"int64(");
      std::ostream::_M_insert<long>((long)this_00);
      std::operator<<((ostream *)this_00,"), ");
      std::operator<<((ostream *)this_00,"float(");
      std::ostream::operator<<(this_00,floatValue);
      std::operator<<((ostream *)this_00,"), ");
      std::operator<<((ostream *)this_00,"double(");
      std::ostream::_M_insert<double>(doubleValue);
      std::operator<<((ostream *)this_00,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SimpleQueriesTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLboolean boolValue;
	GLint	 intValue;
	GLint64   int64Value;
	GLfloat   floatValue;
	GLdouble  doubleValue;

	gl.getBooleanv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &boolValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getBooleanv");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	gl.getInteger64v(GL_MAX_SHADER_COMPILER_THREADS_ARB, &int64Value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getInteger64v");

	gl.getFloatv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &floatValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getFloatv");

	gl.getDoublev(GL_MAX_SHADER_COMPILER_THREADS_ARB, &doubleValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getDoublev");

	if (boolValue != (intValue != 0) || intValue != (GLint)int64Value || intValue != (GLint)floatValue ||
		intValue != (GLint)doubleValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Simple queries returned different values: "
						   << "bool(" << (int)boolValue << "), "
						   << "int(" << intValue << "), "
						   << "int64(" << int64Value << "), "
						   << "float(" << floatValue << "), "
						   << "double(" << doubleValue << ")" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}